

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPileTests.cpp
# Opt level: O3

void __thiscall
solitaire::piles::TableauPileWithCoveredTopCardTest_tryAddCardsOnCoveredTopCard_Test::TestBody
          (TableauPileWithCoveredTopCardTest_tryAddCardsOnCoveredTopCard_Test *this)

{
  element_type *peVar1;
  pointer *__ptr;
  char *pcVar2;
  initializer_list<solitaire::cards::Card> __l;
  Cards cardsLeftAfterAdding;
  Cards cardsToAdd;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_b8;
  char local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_90;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_78;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_60;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_48;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_30;
  
  solitaire::cards::Card::Card((Card *)&local_b8,Nine,Diamond);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_b8;
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_60,__l,(allocator_type *)&local_78);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_78,&local_60);
  peVar1 = (this->super_TableauPileWithCoveredTopCardTest).super_InitializedTableauPileTest.
           super_EmptyTableauPileTest.pile.
           super___shared_ptr<solitaire::piles::TableauPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_TableauPile).super_Archiver._vptr_Archiver[5])(peVar1,&local_60);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_b8,&local_78);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_30,&local_b8);
  if ((Card)local_b8.
            super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
            _M_impl.super__Vector_impl_data._M_start != (Card)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_b8,&local_30);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_90,&local_b8);
  if ((Card)local_b8.
            super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
            _M_impl.super__Vector_impl_data._M_start != (Card)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(local_a0,(char *)&local_90,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "cardsToAdd");
  if (local_90.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_30.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a0[0] == '\0') {
    testing::Message::Message((Message *)&local_b8);
    if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_98->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/TableauPileTests.cpp"
               ,0xc3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((Card)local_b8.
              super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
              _M_impl.super__Vector_impl_data._M_start != (Card)0x0) {
      (**(code **)(*(long *)local_b8.
                            super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                            ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,local_98);
  }
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_b8,
             &(this->super_TableauPileWithCoveredTopCardTest).super_InitializedTableauPileTest.
              pileCards);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_48,&local_b8);
  if ((Card)local_b8.
            super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
            _M_impl.super__Vector_impl_data._M_start != (Card)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_b8,&local_48);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_90,&local_b8);
  if ((Card)local_b8.
            super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
            _M_impl.super__Vector_impl_data._M_start != (Card)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (*(((this->super_TableauPileWithCoveredTopCardTest).super_InitializedTableauPileTest.
      super_EmptyTableauPileTest.pile.
      super___shared_ptr<solitaire::piles::TableauPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_TableauPile).super_Archiver._vptr_Archiver[7])();
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(local_a0,(char *)&local_90,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "pile->getCards()");
  if (local_90.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a0[0] == '\0') {
    testing::Message::Message((Message *)&local_b8);
    if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_98->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/TableauPileTests.cpp"
               ,0xc4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((Card)local_b8.
              super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
              _M_impl.super__Vector_impl_data._M_start != (Card)0x0) {
      (**(code **)(*(long *)local_b8.
                            super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                            ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,local_98);
  }
  if (local_78.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST_F(TableauPileWithCoveredTopCardTest, tryAddCardsOnCoveredTopCard) {
    Cards cardsToAdd {
        Card {Value::Nine, Suit::Diamond}
    };
    const auto cardsLeftAfterAdding = cardsToAdd;

    pile->tryAddCards(cardsToAdd);

    EXPECT_THAT(cardsToAdd, ContainerEq(cardsLeftAfterAdding));
    EXPECT_THAT(pile->getCards(), ContainerEq(pileCards));
}